

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::to_member_reference_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t param_1,SPIRType *type,
          uint32_t index,bool param_4)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  string local_50;
  undefined1 local_2d;
  uint32_t local_2c;
  bool param_4_local;
  SPIRType *pSStack_28;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerGLSL *pCStack_18;
  uint32_t param_1_local;
  CompilerGLSL *this_local;
  
  ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)index;
  local_2d = param_4;
  local_2c = index;
  pSStack_28 = type;
  type_local._4_4_ = param_1;
  pCStack_18 = this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  to_member_name_abi_cxx11_(&local_50,this,type,index);
  join<char_const(&)[2],std::__cxx11::string>
            (__return_storage_ptr__,(spirv_cross *)0x62c2d7,(char (*) [2])&local_50,ts_1);
  ::std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_member_reference(uint32_t, const SPIRType &type, uint32_t index, bool)
{
	return join(".", to_member_name(type, index));
}